

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

Element * __thiscall
Rml::ElementDocument::SearchFocusSubtree(ElementDocument *this,Element *element,bool forward)

{
  CanFocus CVar1;
  int iVar2;
  Element *pEVar3;
  uint index;
  uint uVar4;
  
  CVar1 = anon_unknown_0::CanFocusElement(element);
  if (CVar1 != Yes) {
    if ((CVar1 != NoAndNoChildren) && (iVar2 = Element::GetNumChildren(element,false), 0 < iVar2)) {
      uVar4 = 0;
      do {
        index = uVar4;
        if (!forward) {
          iVar2 = Element::GetNumChildren(element,false);
          index = ~uVar4 + iVar2;
        }
        pEVar3 = Element::GetChild(element,index);
        pEVar3 = SearchFocusSubtree(this,pEVar3,forward);
        if (pEVar3 != (Element *)0x0) {
          return pEVar3;
        }
        uVar4 = uVar4 + 1;
        iVar2 = Element::GetNumChildren(element,false);
      } while ((int)uVar4 < iVar2);
    }
    element = (Element *)0x0;
  }
  return element;
}

Assistant:

Element* ElementDocument::SearchFocusSubtree(Element* element, bool forward)
{
	CanFocus can_focus = CanFocusElement(element);
	if (can_focus == CanFocus::Yes)
		return element;
	else if (can_focus == CanFocus::NoAndNoChildren)
		return nullptr;

	for (int i = 0; i < element->GetNumChildren(); i++)
	{
		int child_index = i;
		if (!forward)
			child_index = element->GetNumChildren() - i - 1;
		if (Element* result = SearchFocusSubtree(element->GetChild(child_index), forward))
			return result;
	}

	return nullptr;
}